

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_z5_operators<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                *matrix)

{
  uint uVar1;
  pointer pUVar2;
  ID_index IVar3;
  Column_dimension_option CVar4;
  ID_index IVar5;
  bool bVar6;
  invalid_argument *this;
  Element EVar7;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  *pUVar8;
  _Hash_node_base *p_Var9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  setcont;
  char *local_3d0;
  char *local_3c8;
  anon_class_16_2_633bb64e local_3c0;
  shared_count sStack_3b0;
  anon_class_16_2_633bb64e local_3a8;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined8 uStack_390;
  pair<unsigned_int,_unsigned_int> local_388;
  pair<unsigned_int,_unsigned_int> pStack_380;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_378;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_360;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_360._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_360._M_impl.super__Rb_tree_header._M_header;
  local_360._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_360._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_360._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pUVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3a8.this = pUVar2;
  local_360._M_impl.super__Rb_tree_header._M_header._M_right =
       local_360._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = Gudhi::persistence_matrix::
          Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
          ::
          _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
                    ((Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
                      *)pUVar2,pUVar2 + 1,(anon_class_1_0_00000001 *)&local_3c0,
                     (anon_class_8_1_8991fb9c *)&local_3a8);
  if (bVar6) {
    CVar4.dim_ = (pUVar2->super_Column_dimension_option).dim_;
    IVar5 = (pUVar2->super_Chain_column_option).pivot_;
    IVar3 = pUVar2[1].super_Chain_column_option.pivot_;
    pUVar2->super_Column_dimension_option =
         (Column_dimension_option)pUVar2[1].super_Column_dimension_option.dim_;
    (pUVar2->super_Chain_column_option).pivot_ = IVar3;
    pUVar2[1].super_Column_dimension_option = (Column_dimension_option)CVar4.dim_;
    pUVar2[1].super_Chain_column_option.pivot_ = IVar5;
  }
  pUVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3a8.this = pUVar2 + 1;
  bVar6 = Gudhi::persistence_matrix::
          Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
          ::
          _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
                    ((Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
                      *)local_3a8.this,pUVar2 + 2,(anon_class_1_0_00000001 *)&local_3c0,
                     (anon_class_8_1_8991fb9c *)&local_3a8);
  if (bVar6) {
    CVar4.dim_ = pUVar2[1].super_Column_dimension_option.dim_;
    IVar5 = pUVar2[1].super_Chain_column_option.pivot_;
    IVar3 = pUVar2[2].super_Chain_column_option.pivot_;
    pUVar2[1].super_Column_dimension_option =
         (Column_dimension_option)pUVar2[2].super_Column_dimension_option.dim_;
    pUVar2[1].super_Chain_column_option.pivot_ = IVar3;
    pUVar2[2].super_Column_dimension_option = (Column_dimension_option)CVar4.dim_;
    pUVar2[2].super_Chain_column_option.pivot_ = IVar5;
  }
  local_3a8.this =
       (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *)0x400000001;
  local_3a8.val._0_4_ = 2;
  local_3a8.val._4_4_ = 1;
  local_398 = 3;
  uStack_394 = 3;
  uStack_390._0_4_ = 6;
  uStack_390._4_4_ = 1;
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&local_360,(pair<unsigned_int,_unsigned_int> *)&local_3a8,&local_388);
  local_398 = 0;
  uStack_394 = 0;
  uStack_390._0_4_ = 1;
  local_3a8.this =
       (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *)0x400000000;
  local_3a8.val._0_4_ = 1;
  local_3a8.val._4_4_ = 3;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_378,&local_3a8);
  column_test_common_content_access<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&local_360,&local_378);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x17a);
  pUVar8 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 1;
  bVar6 = Gudhi::persistence_matrix::operator==(pUVar8,pUVar8);
  local_3c0.val = (Field_element *)0x0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  uStack_390 = &local_3d0;
  local_3d0 = "matrix[1] == matrix[1]";
  local_3c8 = "";
  local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
  local_3a8.this =
       (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fd370;
  local_398 = 0x205128;
  uStack_394 = 0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_3c0.this._0_1_ = bVar6;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x17b);
  pUVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0.this._0_1_ = Gudhi::persistence_matrix::operator==(pUVar2 + 1,pUVar2 + 3);
  local_3c0.val = (Field_element *)0x0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[1] == matrix[3]";
  local_3c8 = "";
  local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
  local_3a8.this =
       (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fd370;
  local_398 = 0x205128;
  uStack_394 = 0;
  uStack_390 = &local_3d0;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x17c);
  pUVar8 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0.this._0_1_ = Gudhi::persistence_matrix::operator<(pUVar8 + 1,pUVar8);
  local_3c0.val = (Field_element *)0x0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[1] < matrix[0]";
  local_3c8 = "";
  local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
  local_3a8.this =
       (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fd370;
  local_398 = 0x205128;
  uStack_394 = 0;
  uStack_390 = &local_3d0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x180);
  pUVar8 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c0.this._0_1_ = Gudhi::persistence_matrix::operator<(pUVar8 + 2,pUVar8);
  local_3c0.val = (Field_element *)0x0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "matrix[2] < matrix[0]";
  local_3c8 = "";
  local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
  local_3a8.this =
       (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fd370;
  local_398 = 0x205128;
  uStack_394 = 0;
  uStack_390 = &local_3d0;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x182);
  pUVar8 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar6 = Gudhi::persistence_matrix::operator<(pUVar8,pUVar8);
  local_3c0.this =
       (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *)CONCAT71(local_3c0.this._1_7_,!bVar6);
  local_3c0.val = (Field_element *)0x0;
  sStack_3b0.pi_ = (sp_counted_base *)0x0;
  local_3d0 = "!(matrix[0] < matrix[0])";
  local_3c8 = "";
  local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
  local_3a8.this =
       (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fd370;
  local_398 = 0x205128;
  uStack_394 = 0;
  uStack_390 = &local_3d0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3b0);
  pUVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar1 = pUVar2->operators_->characteristic_;
  EVar7 = 4;
  if (uVar1 < 5) {
    EVar7 = (Element)(4 % (ulong)uVar1);
  }
  if (EVar7 != 1) {
    if (EVar7 == 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"A chain column should not be multiplied by 0.");
      goto LAB_00155007;
    }
    for (p_Var9 = (pUVar2->column_)._M_h._M_before_begin._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
        p_Var9 = p_Var9->_M_nxt) {
      Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                (pUVar2->operators_,(Element *)((long)&(p_Var9[1]._M_nxt)->_M_nxt + 4),EVar7);
    }
  }
  pUVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (pUVar2[1].operators_)->characteristic_;
  EVar7 = 2;
  if (uVar1 < 3) {
    EVar7 = (Element)(2 % (ulong)uVar1);
  }
  if (EVar7 != 1) {
    if (EVar7 == 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"A chain column should not be multiplied by 0.");
      goto LAB_00155007;
    }
    for (p_Var9 = pUVar2[1].column_._M_h._M_before_begin._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
        p_Var9 = p_Var9->_M_nxt) {
      Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                (pUVar2[1].operators_,(Element *)((long)&(p_Var9[1]._M_nxt)->_M_nxt + 4),EVar7);
    }
  }
  if (1 < ((matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[2].operators_)->characteristic_) {
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x100000001;
    local_3a8.val._0_4_ = 2;
    local_3a8.val._4_4_ = 4;
    local_398 = 3;
    uStack_394 = 2;
    uStack_390._0_4_ = 6;
    uStack_390._4_4_ = 4;
    std::
    _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
              ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&local_360,(pair<unsigned_int,_unsigned_int> *)&local_3a8,&local_388);
    local_398 = 0;
    uStack_394 = 0;
    uStack_390._0_4_ = 4;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x100000000;
    local_3a8.val._0_4_ = 4;
    local_3a8.val._4_4_ = 2;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_378,&local_3a8);
    column_test_common_content_access<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
              ((matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)&local_360,&local_378);
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x100000000;
    local_3a8.val._0_4_ = 1;
    local_3a8.val._4_4_ = 3;
    local_398 = 2;
    uStack_394 = 4;
    uStack_390._0_4_ = 5;
    uStack_390._4_4_ = 4;
    local_388.first = 6;
    local_388.second = 4;
    std::
    _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
              ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&local_360,(pair<unsigned_int,_unsigned_int> *)&local_3a8,&pStack_380);
    local_398 = 0;
    uStack_394 = 4;
    uStack_390._0_4_ = 4;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x300000001;
    local_3a8.val._0_4_ = 4;
    local_3a8.val._4_4_ = 0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_378,&local_3a8);
    column_test_common_content_access<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
              ((matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2,
               (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)&local_360,&local_378);
    local_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_128 = "";
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x18e);
    pUVar8 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1;
    bVar6 = Gudhi::persistence_matrix::operator==(pUVar8,pUVar8);
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "matrix[1] == matrix[1]";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_150 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_148 = "";
    local_3c0.this._0_1_ = bVar6;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_158 = "";
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,399);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3c0.this._0_1_ = Gudhi::persistence_matrix::operator==(pUVar2 + 1,pUVar2 + 3);
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "matrix[1] == matrix[3]";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_178 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_188 = "";
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,400);
    pUVar8 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3c0.this._0_1_ = Gudhi::persistence_matrix::operator<(pUVar8 + 1,pUVar8);
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "matrix[1] < matrix[0]";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_1b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_1a8 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    local_1c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_1b8 = "";
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x194);
    pUVar8 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3c0.this._0_1_ = Gudhi::persistence_matrix::operator<(pUVar8 + 2,pUVar8);
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "matrix[2] < matrix[0]";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_1e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_1d8 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    local_1f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_1e8 = "";
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x196);
    pUVar8 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar6 = Gudhi::persistence_matrix::operator<(pUVar8,pUVar8);
    local_3c0.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)CONCAT71(local_3c0.this._1_7_,!bVar6);
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "!(matrix[0] < matrix[0])";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_208 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)CONCAT44(local_3a8.this._4_4_,4);
    bVar6 = Gudhi::persistence_matrix::
            Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
            ::
            _multiply_target_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
                      ((Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
                        *)(pUVar2 + 4),(Field_element *)&local_3a8,pUVar2 + 5);
    if (bVar6) {
      CVar4.dim_ = pUVar2[4].super_Column_dimension_option.dim_;
      IVar5 = pUVar2[4].super_Chain_column_option.pivot_;
      IVar3 = pUVar2[5].super_Chain_column_option.pivot_;
      pUVar2[4].super_Column_dimension_option =
           (Column_dimension_option)pUVar2[5].super_Column_dimension_option.dim_;
      pUVar2[4].super_Chain_column_option.pivot_ = IVar3;
      pUVar2[5].super_Column_dimension_option = (Column_dimension_option)CVar4.dim_;
      pUVar2[5].super_Chain_column_option.pivot_ = IVar5;
    }
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x300000000;
    local_3a8.val._0_4_ = 2;
    local_3a8.val._4_4_ = 1;
    local_398 = 3;
    uStack_394 = 2;
    uStack_390._0_4_ = 5;
    uStack_390._4_4_ = 2;
    local_388.first = 6;
    local_388.second = 1;
    std::
    _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
              ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&local_360,(pair<unsigned_int,_unsigned_int> *)&local_3a8,&pStack_380);
    local_398 = 0;
    uStack_394 = 2;
    uStack_390._0_4_ = 1;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x3;
    local_3a8.val._0_4_ = 1;
    local_3a8.val._4_4_ = 2;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_378,&local_3a8);
    column_test_common_content_access<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
              ((matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 4,
               (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)&local_360,&local_378);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3c0.this = pUVar2 + 5;
    local_3d0._0_4_ = 3;
    local_3c0.val = (Field_element *)&local_3d0;
    local_3a8.this = local_3c0.this;
    local_3a8.val = local_3c0.val;
    bVar6 = Gudhi::persistence_matrix::
            Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
            ::
            _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_multiply_source_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,unsigned_int_const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_multiply_source_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,unsigned_int_const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
                      ((Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
                        *)local_3c0.this,pUVar2 + 3,&local_3a8,&local_3c0);
    if (bVar6) {
      IVar3 = pUVar2[3].super_Chain_column_option.pivot_;
      CVar4.dim_ = pUVar2[5].super_Column_dimension_option.dim_;
      IVar5 = pUVar2[5].super_Chain_column_option.pivot_;
      pUVar2[5].super_Column_dimension_option =
           (Column_dimension_option)pUVar2[3].super_Column_dimension_option.dim_;
      pUVar2[5].super_Chain_column_option.pivot_ = IVar3;
      pUVar2[3].super_Column_dimension_option = (Column_dimension_option)CVar4.dim_;
      pUVar2[3].super_Chain_column_option.pivot_ = IVar5;
    }
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x400000000;
    local_3a8.val._0_4_ = 1;
    local_3a8.val._4_4_ = 2;
    local_398 = 2;
    uStack_394 = 1;
    uStack_390._0_4_ = 5;
    uStack_390._4_4_ = 1;
    local_388.first = 6;
    local_388.second = 1;
    std::
    _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
              ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&local_360,(pair<unsigned_int,_unsigned_int> *)&local_3a8,&pStack_380);
    local_398 = 0;
    uStack_394 = 1;
    uStack_390._0_4_ = 1;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x200000004;
    local_3a8.val._0_4_ = 1;
    local_3a8.val._4_4_ = 0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_378,&local_3a8);
    column_test_common_content_access<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
              ((matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 5,
               (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)&local_360,&local_378);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3c0.this = pUVar2 + 5;
    local_3d0 = (char *)CONCAT44(local_3d0._4_4_,3);
    local_3c0.val = (Field_element *)&local_3d0;
    local_3a8.this = local_3c0.this;
    local_3a8.val = local_3c0.val;
    bVar6 = Gudhi::persistence_matrix::
            Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
            ::
            _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_multiply_source_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,unsigned_int_const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_multiply_source_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,unsigned_int_const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
                      ((Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
                        *)local_3c0.this,pUVar2 + 4,&local_3a8,&local_3c0);
    if (bVar6) {
      IVar3 = pUVar2[4].super_Chain_column_option.pivot_;
      CVar4.dim_ = pUVar2[5].super_Column_dimension_option.dim_;
      IVar5 = pUVar2[5].super_Chain_column_option.pivot_;
      pUVar2[5].super_Column_dimension_option =
           (Column_dimension_option)pUVar2[4].super_Column_dimension_option.dim_;
      pUVar2[5].super_Chain_column_option.pivot_ = IVar3;
      pUVar2[4].super_Column_dimension_option = (Column_dimension_option)CVar4.dim_;
      pUVar2[4].super_Chain_column_option.pivot_ = IVar5;
    }
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x300000000;
    local_3a8.val._0_4_ = 1;
    local_3a8.val._4_4_ = 2;
    local_398 = 2;
    uStack_394 = 4;
    uStack_390._0_4_ = 3;
    uStack_390._4_4_ = 1;
    local_388.first = 5;
    local_388.second = 2;
    pStack_380.first = 6;
    pStack_380.second = 4;
    std::
    _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
              ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&local_360,(pair<unsigned_int,_unsigned_int> *)&local_3a8,
               (pair<unsigned_int,_unsigned_int> *)&local_378);
    local_398 = 0;
    uStack_394 = 2;
    uStack_390._0_4_ = 4;
    local_3a8.this._0_4_ = 3;
    local_3a8.this._4_4_ = 2;
    local_3a8.val._0_4_ = 4;
    local_3a8.val._4_4_ = 1;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_378,&local_3a8);
    column_test_common_content_access<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
              ((matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 5,
               (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)&local_360,&local_378);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)CONCAT44(local_3a8.this._4_4_,4);
    bVar6 = Gudhi::persistence_matrix::
            Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
            ::
            _multiply_target_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
                      ((Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
                        *)(pUVar2 + 3),(Field_element *)&local_3a8,pUVar2 + 5);
    if (bVar6) {
      CVar4.dim_ = pUVar2[3].super_Column_dimension_option.dim_;
      IVar5 = pUVar2[3].super_Chain_column_option.pivot_;
      IVar3 = pUVar2[5].super_Chain_column_option.pivot_;
      pUVar2[3].super_Column_dimension_option =
           (Column_dimension_option)pUVar2[5].super_Column_dimension_option.dim_;
      pUVar2[3].super_Chain_column_option.pivot_ = IVar3;
      pUVar2[5].super_Column_dimension_option = (Column_dimension_option)CVar4.dim_;
      pUVar2[5].super_Chain_column_option.pivot_ = IVar5;
    }
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x300000000;
    local_3a8.val._0_4_ = 1;
    local_3a8.val._4_4_ = 2;
    local_398 = 2;
    uStack_394 = 4;
    uStack_390._0_4_ = 3;
    uStack_390._4_4_ = 1;
    local_388.first = 5;
    local_388.second = 2;
    pStack_380.first = 6;
    pStack_380.second = 4;
    std::
    _Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::_M_assign_unique<std::pair<unsigned_int,unsigned_int>const*>
              ((_Rb_tree<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>,std::_Identity<std::pair<unsigned_int,unsigned_int>>,std::less<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&local_360,(pair<unsigned_int,_unsigned_int> *)&local_3a8,
               (pair<unsigned_int,_unsigned_int> *)&local_378);
    local_398 = 0;
    uStack_394 = 2;
    uStack_390._0_4_ = 4;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)0x200000003;
    local_3a8.val._0_4_ = 4;
    local_3a8.val._4_4_ = 1;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_378,&local_3a8);
    column_test_common_content_access<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
              ((matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3,
               (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)&local_360,&local_378);
    local_220 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x1ac);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar6 = Gudhi::persistence_matrix::operator==(pUVar2 + 3,pUVar2 + 5);
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "matrix[3] == matrix[5]";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_238 = "";
    local_3c0.this._0_1_ = bVar6;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    local_250 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_248 = "";
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    local_258 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x1ad);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar6 = Gudhi::persistence_matrix::operator==(pUVar2 + 5,pUVar2 + 4);
    local_3c0.this._0_1_ = !bVar6;
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "!(matrix[5] == matrix[4])";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_270 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_268 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_278 = "";
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x1ae);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar6 = Gudhi::persistence_matrix::operator<(pUVar2 + 5,pUVar2 + 3);
    local_3c0.this._0_1_ = !bVar6;
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "!(matrix[5] < matrix[3])";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_2a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_298 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    local_2b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_2a8 = "";
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x1af);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar6 = Gudhi::persistence_matrix::operator<(pUVar2 + 3,pUVar2 + 5);
    local_3c0.this._0_1_ = !bVar6;
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "!(matrix[3] < matrix[5])";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_2d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_2c8 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    local_2e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_2d8 = "";
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x1b4);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3c0.this._0_1_ = Gudhi::persistence_matrix::operator<(pUVar2 + 5,pUVar2 + 4);
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "matrix[5] < matrix[4]";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_300 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_2f8 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    local_310 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_308 = "";
    local_320 = &boost::unit_test::basic_cstring<char_const>::null;
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x1b5);
    pUVar2 = (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar6 = Gudhi::persistence_matrix::operator<(pUVar2 + 3,pUVar2 + 4);
    local_3c0.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)CONCAT71(local_3c0.this._1_7_,bVar6);
    local_3c0.val = (Field_element *)0x0;
    sStack_3b0.pi_ = (sp_counted_base *)0x0;
    local_3d0 = "matrix[3] < matrix[4]";
    local_3c8 = "";
    local_3a8.val._0_4_ = (uint)local_3a8.val & 0xffffff00;
    local_3a8.this =
         (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
          *)&PTR__lazy_ostream_001fd370;
    local_398 = 0x205128;
    uStack_394 = 0;
    uStack_390 = &local_3d0;
    local_330 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_328 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_3b0);
    if ((pair<unsigned_int,_unsigned_int>)
        local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pair<unsigned_int,_unsigned_int>)0x0) {
      operator_delete(local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_378.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_378.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~_Rb_tree(&local_360);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"A chain column should not be multiplied by 0.");
LAB_00155007:
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void column_test_common_z5_operators(std::vector<Column>& matrix) {
  std::set<std::pair<unsigned int, typename Column::Field_element> > setcont;
  std::vector<typename Column::Field_element> veccont;

  matrix[0] += matrix[1];
  matrix[1] += matrix[2];

  setcont = {{1, 4}, {2, 1}, {3, 3}, {6, 1}};
  veccont = {0, 4, 1, 3, 0, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);
  BOOST_CHECK(matrix[1] == matrix[1]);
  BOOST_CHECK(matrix[1] == matrix[3]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  matrix[0] *= 4;
  matrix[1] *= 2;
  matrix[2] *= 1;

  setcont = {{1, 1}, {2, 4}, {3, 2}, {6, 4}};
  veccont = {0, 1, 4, 2, 0, 0, 4};
  column_test_common_content_access(matrix[0], setcont, veccont);
  setcont = {{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}};
  veccont = {1, 3, 4, 0, 0, 4, 4};
  column_test_common_content_access(matrix[2], setcont, veccont);
  BOOST_CHECK(matrix[1] == matrix[1]);
  BOOST_CHECK(matrix[1] == matrix[3]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, matrix[5]);
  setcont = {{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}};
  veccont = {3, 0, 1, 2, 0, 2, 1};
  column_test_common_content_access(matrix[4], setcont, veccont);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[3], 3);
  setcont = {{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}};
  veccont = {4, 2, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[4], 3);
  setcont = {{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}};
  veccont = {3, 2, 4, 1, 0, 2, 4};
  column_test_common_content_access(matrix[5], setcont, veccont);
  // this = v * this + column
  matrix[3].multiply_target_and_add(4, matrix[5]);
  setcont = {{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}};
  veccont = {3, 2, 4, 1, 0, 2, 4};
  column_test_common_content_access(matrix[3], setcont, veccont);
  BOOST_CHECK(matrix[3] == matrix[5]);
  BOOST_CHECK(!(matrix[5] == matrix[4]));
  BOOST_CHECK(!(matrix[5] < matrix[3]));
  BOOST_CHECK(!(matrix[3] < matrix[5]));
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[4] < matrix[5]);
    BOOST_CHECK(matrix[4] < matrix[3]);
  } else {
    BOOST_CHECK(matrix[5] < matrix[4]);
    BOOST_CHECK(matrix[3] < matrix[4]);
  }
}